

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void pop_heap_suite::pop_decreasing_custom(void)

{
  array<int,_5UL> heap;
  int local_54 [3];
  array<int,_5UL> expect;
  int local_34;
  
  heap._M_elems[0] = 0x2c;
  heap._M_elems[1] = 0x37;
  heap._M_elems[2] = 0x21;
  heap._M_elems[3] = 0x16;
  heap._M_elems[4] = 0xb;
  vista::pop_heap<false,int*,xless<int,1431655765>>(&heap,local_54);
  heap._M_elems[4] = 0;
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x37;
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0x16;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,699,"void pop_heap_suite::pop_decreasing_custom()",heap._M_elems,local_54,
             expect._M_elems,&local_34);
  vista::pop_heap<false,int*,xless<int,1431655765>>(&heap,heap._M_elems + 4);
  heap._M_elems[3] = 0;
  expect._M_elems[0] = 0x37;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0xb;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2c2,"void pop_heap_suite::pop_decreasing_custom()",heap._M_elems,local_54,
             expect._M_elems,&local_34);
  vista::pop_heap<false,int*,xless<int,1431655765>>(&heap,heap._M_elems + 3);
  heap._M_elems[2] = 0;
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2c9,"void pop_heap_suite::pop_decreasing_custom()",heap._M_elems,local_54,
             expect._M_elems,&local_34);
  vista::pop_heap<false,int*,xless<int,1431655765>>(&heap,heap._M_elems + 2);
  heap._M_elems[1] = 0;
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  expect._M_elems[4] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2d0,"void pop_heap_suite::pop_decreasing_custom()",heap._M_elems,local_54,
             expect._M_elems,&local_34);
  vista::pop_heap<false,int*,xless<int,1431655765>>(&heap,heap._M_elems + 1);
  heap._M_elems[0] = 0;
  expect._M_elems[4] = 0;
  expect._M_elems[0] = 0;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2d7,"void pop_heap_suite::pop_decreasing_custom()",heap._M_elems,local_54,
             expect._M_elems,&local_34);
  return;
}

Assistant:

void pop_decreasing_custom()
{
    xless<int, 0x55555555> custom;

    std::array<int, 5> heap = { 44, 55, 33, 22, 11 }; // Result of push_suite::push_decreasing_custom
    auto last = heap.end();
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 33, 55, 11, 22, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 55, 22, 11, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 11, 22, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 22, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}